

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int minstadisintegrate(monst *mon)

{
  ushort uVar1;
  permonst *ppVar2;
  boolean bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  
  if ((mon->mintrinsics & 8) != 0) {
    return 0;
  }
  uVar1 = mon->data->cwt;
  uVar4 = mt_random();
  if ((uVar4 * -0x33333333 >> 2 | uVar4 * 0x40000000) < 0xccccccd) {
    return 0;
  }
  uVar4 = 1;
  if (100 < uVar1) {
    uVar4 = (uVar1 >> 2) / 0x19;
  }
  uVar5 = mt_random();
  uVar8 = 5;
  if (uVar5 % uVar4 < 5) {
    uVar8 = uVar5 % uVar4;
  }
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
         (((viz_array[mon->my][mon->mx] & 1U) != 0 && ((mon->data->mflags3 & 0x200) != 0))))))))
    goto LAB_00268bd9;
  }
  else {
    bVar3 = worm_known(level,mon);
    if (bVar3 != '\0') {
LAB_00268bd9:
      uVar4 = *(uint *)&mon->field_0x60;
      if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar4 & 0x280) == 0) goto LAB_00268c21;
      }
      else if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00268c21:
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar6 = Monnam(mon);
          pline("%s disintegrates!",pcVar6);
        }
      }
    }
  }
  ppVar2 = mon->data;
  if (ppVar2 != mons + 0x145 && (ppVar2 != mons + 0x146 && ppVar2 != mons + 0x144)) {
    mondead_helper(mon,5);
    return uVar8 + 1;
  }
  if (mon->wormno == '\0') {
    if (((viz_array[mon->my][mon->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mon->my][mon->mx] & 1U) == 0 || ((ppVar2->mflags3 & 0x200) == 0))))))))
    goto LAB_00268e48;
  }
  else {
    bVar3 = worm_known(level,mon);
    if (bVar3 == '\0') goto LAB_00268e48;
  }
  uVar4 = *(uint *)&mon->field_0x60;
  if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar4 & 0x280) != 0) goto LAB_00268e48;
  }
  else if (((uVar4 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00268e48;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar6 = Monnam(mon);
    pcVar6 = s_suffix(pcVar6);
    if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
       (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
      pcVar7 = body_part(1);
    }
    else {
      pcVar7 = body_part(1);
      pcVar7 = makeplural(pcVar7);
    }
    pline("%s body reintegrates before your %s!",pcVar6,pcVar7);
  }
LAB_00268e48:
  mon->mhp = mon->mhpmax;
  return uVar8 + 1;
}

Assistant:

int minstadisintegrate(struct monst *mon)
{
	int result = mon->data->cwt;
	if (resists_disint(mon) || !rn2(20)) return 0;
	weight_dmg(result);
	if (canseemon(level, mon))
	    pline("%s disintegrates!", Monnam(mon));
	if (is_rider(mon->data)) {
	    if (canseemon(level, mon)) {
		pline("%s body reintegrates before your %s!",
		      s_suffix(Monnam(mon)),
		      (eyecount(youmonst.data) == 1) ?
			  body_part(EYE) : makeplural(body_part(EYE)));
	    }
	    mon->mhp = mon->mhpmax;
	} else {
	    mondead_helper(mon, AD_DISN);
	}
	return result;
}